

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O2

Vec3fa __thiscall
embree::MetalMaterial__eval
          (embree *this,ISPCMetalMaterial *This,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,
          Vec3fa *wi)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar17;
  undefined1 auVar15 [16];
  float fVar18;
  float fVar19;
  float __y;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Vec3fa VVar25;
  FresnelConductor fresnel;
  Vec3fa F;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined1 auVar16 [16];
  
  local_48._0_8_ = *(undefined8 *)&(This->eta).field_0;
  local_48._8_8_ = *(undefined8 *)((long)&(This->eta).field_0 + 8);
  local_38 = *(undefined8 *)&(This->k).field_0;
  uStack_30 = *(undefined8 *)((long)&(This->k).field_0 + 8);
  fVar5 = (wo->field_0).m128[0];
  fVar7 = (wo->field_0).m128[1];
  fVar6 = (dg->Ns).field_0.m128[0];
  fVar23 = (dg->Ns).field_0.m128[1];
  fVar1 = (dg->Ns).field_0.m128[2];
  fVar2 = (dg->Ns).field_0.m128[3];
  fVar8 = fVar7 * fVar23;
  fVar9 = (wo->field_0).m128[2] * fVar1;
  fVar10 = (wo->field_0).m128[3] * fVar2;
  fVar18 = fVar8 + fVar5 * fVar6 + fVar9;
  fVar8 = fVar8 + fVar8 + fVar10;
  fVar19 = 0.0;
  fVar20 = 0.0;
  fVar21 = 0.0;
  fVar22 = 0.0;
  if (0.0 < fVar18) {
    fVar9 = (wi->field_0).m128[0];
    fVar10 = (wi->field_0).m128[1];
    fVar3 = (wi->field_0).m128[2];
    fVar4 = (wi->field_0).m128[3];
    fVar17 = fVar23 * fVar10;
    fVar24 = fVar17 + fVar6 * fVar9 + fVar1 * fVar3;
    if (0.0 < fVar24) {
      fVar22 = This->roughness;
      auVar15 = rcpss(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
      __y = (2.0 - fVar22 * auVar15._0_4_) * auVar15._0_4_;
      fVar5 = fVar5 + fVar9;
      fVar7 = fVar7 + fVar10;
      fVar22 = (wo->field_0).m128[2] + fVar3;
      fVar19 = (wo->field_0).m128[3] + fVar4;
      fVar20 = fVar7 * fVar7;
      fVar21 = fVar22 * fVar22;
      fVar19 = fVar19 * fVar19;
      fVar14 = fVar20 + fVar5 * fVar5 + fVar21;
      auVar16._0_8_ = CONCAT44(fVar20 + fVar20 + fVar19,fVar14);
      auVar16._8_4_ = fVar20 + fVar21 + fVar21;
      auVar16._12_4_ = fVar20 + fVar19 + fVar19;
      auVar11._8_4_ = auVar16._8_4_;
      auVar11._0_8_ = auVar16._0_8_;
      auVar11._12_4_ = auVar16._12_4_;
      auVar15 = rsqrtss(auVar11,auVar16);
      fVar19 = auVar15._0_4_;
      fVar19 = fVar19 * fVar19 * fVar14 * -0.5 * fVar19 + fVar19 * 1.5;
      fVar23 = fVar1 * fVar19 * fVar22 + fVar23 * fVar19 * fVar7 + fVar6 * fVar19 * fVar5;
      fVar5 = fVar19 * fVar7 * fVar10 + fVar19 * fVar5 * fVar9 + fVar19 * fVar22 * fVar3;
      eval((embree *)&local_28,(FresnelConductor *)&local_48.field_1,fVar5);
      fVar6 = powf(ABS(fVar23),__y);
      fVar6 = fVar6 * (__y + 2.0) * 0.15915494;
      fVar23 = fVar23 + fVar23;
      auVar12._0_4_ = fVar23 * fVar18;
      auVar12._4_4_ = fVar23 * fVar24;
      auVar12._8_4_ = fVar23 * fVar8;
      auVar12._12_4_ = fVar23 * (fVar17 + fVar17 + fVar2 * fVar4);
      auVar15._4_4_ = fVar5;
      auVar15._0_4_ = fVar5;
      auVar15._8_4_ = fVar5;
      auVar15._12_4_ = fVar5;
      auVar13 = divps(auVar12,auVar15);
      if (auVar13._4_4_ <= auVar13._0_4_) {
        auVar13._0_4_ = auVar13._4_4_;
      }
      fVar23 = 1.0;
      if (auVar13._0_4_ <= 1.0) {
        fVar23 = auVar13._0_4_;
      }
      fVar9 = fVar23 * fVar6 * (This->reflectance).field_0.m128[0] * local_28;
      fVar10 = fVar23 * fVar6 * (This->reflectance).field_0.m128[1] * fStack_24;
      fVar7 = 0.0;
      fVar18 = fVar18 * 4.0;
      auVar15 = rcpss(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18));
      fVar5 = fVar18 * auVar15._0_4_;
      fVar22 = (2.0 - fVar5) * auVar15._0_4_;
      fVar19 = fVar22 * fVar9;
      fVar20 = fVar22 * fVar10;
      fVar21 = fVar22 * fVar23 * fVar6 * (This->reflectance).field_0.m128[2] * fStack_20;
      fVar22 = fVar22 * fVar23 * fVar6 * (This->reflectance).field_0.m128[3] * fStack_1c;
    }
  }
  *(float *)this = fVar19;
  *(float *)(this + 4) = fVar20;
  *(float *)(this + 8) = fVar21;
  *(float *)(this + 0xc) = fVar22;
  VVar25.field_0.m128[1] = fVar7;
  VVar25.field_0.m128[0] = fVar5;
  VVar25.field_0.m128[3] = fVar10;
  VVar25.field_0.m128[2] = fVar9;
  return (Vec3fa)VVar25.field_0;
}

Assistant:

Vec3fa MetalMaterial__eval(ISPCMetalMaterial* This, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  const FresnelConductor fresnel = make_FresnelConductor(Vec3fa(This->eta),Vec3fa(This->k));
  const PowerCosineDistribution distribution = make_PowerCosineDistribution(rcp(This->roughness));

  const float cosThetaO = dot(wo,dg.Ns);
  const float cosThetaI = dot(wi,dg.Ns);
  if (cosThetaI <= 0.0f || cosThetaO <= 0.0f) return Vec3fa(0.f);
  const Vec3fa wh = normalize(wi+wo);
  const float cosThetaH = dot(wh, dg.Ns);
  const float cosTheta = dot(wi, wh); // = dot(wo, wh);
  const Vec3fa F = eval(fresnel,cosTheta);
  const float D = eval(distribution,cosThetaH);
  const float G = min(1.0f, min(2.0f * cosThetaH * cosThetaO / cosTheta,
                                2.0f * cosThetaH * cosThetaI / cosTheta));
  return (Vec3fa(This->reflectance)*F) * D * G * rcp(4.0f*cosThetaO);
}